

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelfCwiseBinaryOp.h
# Opt level: O3

SelfCwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>_>_>_>
* __thiscall
Eigen::
SelfCwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_-1,_false>,_-1,_1,_true>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_false>_>_>_>
::operator=(SelfCwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>_>_>_>
            *this,CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>_>_>
                  *_rhs)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  ulong uVar4;
  PointerType pdVar5;
  PointerType pdVar6;
  double dVar7;
  double dVar8;
  Index index_1;
  long lVar9;
  Index index;
  ulong uVar10;
  ulong uVar11;
  
  uVar4 = (_rhs->m_xpr).m_xpr.
          super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false,_Eigen::Dense>
          .super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false,_true>
          .
          super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>,_0>
          .m_rows.m_value;
  if ((this->m_matrix->
      super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true,_Eigen::Dense>
      ).
      super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true,_true>
      .
      super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true>,_1>
      .
      super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true>,_0>
      .m_rows.m_value != uVar4) {
    __assert_fail("rows() == rhs.rows() && cols() == rhs.cols()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/SelfCwiseBinaryOp.h"
                  ,0x88,
                  "SelfCwiseBinaryOp<BinOp, Lhs, Rhs> &Eigen::SelfCwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>>>, -1, 1, true>, Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Block<const Eigen::Matrix<double, -1, -1>, -1, 1>>>>::lazyAssign(const DenseBase<RhsDerived> &) [BinOp = Eigen::internal::scalar_difference_op<double>, Lhs = Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>>>, -1, 1, true>, Rhs = Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Block<const Eigen::Matrix<double, -1, -1>, -1, 1>>>, RhsDerived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Block<const Eigen::Matrix<double, -1, -1>, -1, 1>>>]"
                 );
  }
  pdVar5 = (_rhs->m_xpr).m_xpr.
           super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false,_Eigen::Dense>
           .
           super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false,_true>
           .
           super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>,_0>
           .m_data;
  pdVar6 = (this->m_matrix->
           super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true,_Eigen::Dense>
           ).
           super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true,_true>
           .
           super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true>,_1>
           .
           super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true>,_0>
           .m_data;
  uVar10 = (ulong)((uint)((ulong)pdVar6 >> 3) & 1);
  if ((long)uVar4 <= (long)uVar10) {
    uVar10 = uVar4;
  }
  dVar2 = (_rhs->m_xpr).m_functor.m_other;
  if (((ulong)pdVar6 & 7) != 0) {
    uVar10 = uVar4;
  }
  dVar3 = (_rhs->m_functor).m_other;
  lVar9 = uVar4 - uVar10;
  if (0 < (long)uVar10) {
    uVar11 = 0;
    do {
      pdVar6[uVar11] = pdVar6[uVar11] - pdVar5[uVar11] * dVar2 * dVar3;
      uVar11 = uVar11 + 1;
    } while (uVar10 != uVar11);
  }
  uVar11 = (lVar9 - (lVar9 >> 0x3f) & 0xfffffffffffffffeU) + uVar10;
  if (1 < lVar9) {
    do {
      pdVar6 = (this->m_matrix->
               super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true,_Eigen::Dense>
               ).
               super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true,_true>
               .
               super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true>,_1>
               .
               super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true>,_0>
               .m_data;
      pdVar1 = pdVar6 + uVar10;
      dVar7 = pdVar1[1];
      dVar8 = (pdVar5 + uVar10)[1];
      pdVar6 = pdVar6 + uVar10;
      *pdVar6 = *pdVar1 - pdVar5[uVar10] * dVar2 * dVar3;
      pdVar6[1] = dVar7 - dVar8 * dVar2 * dVar3;
      uVar10 = uVar10 + 2;
    } while ((long)uVar10 < (long)uVar11);
  }
  if ((long)uVar11 < (long)uVar4) {
    pdVar6 = (this->m_matrix->
             super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true,_Eigen::Dense>
             ).
             super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true,_true>
             .
             super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true>,_1>
             .
             super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true>,_0>
             .m_data;
    do {
      pdVar6[uVar11] = pdVar6[uVar11] - pdVar5[uVar11] * dVar2 * dVar3;
      uVar11 = uVar11 + 1;
    } while (uVar4 != uVar11);
  }
  return this;
}

Assistant:

SelfCwiseBinaryOp& operator=(const Rhs& _rhs)
    {
      typename internal::nested<Rhs>::type rhs(_rhs);
      return Base::operator=(rhs);
    }